

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O1

Mat * ssd(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  _InputArray *p_Var9;
  size_type __n;
  int iVar10;
  undefined7 in_register_00000009;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  char in_R8B;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  Mat *this;
  Mat local_2a0 [8];
  Mat depth;
  long local_290;
  long *local_258;
  Mat local_240 [8];
  Mat left;
  long local_230;
  long *local_1f8;
  Mat local_1e0 [8];
  Mat right;
  long local_1d0;
  long *local_198;
  _OutputArray local_180;
  undefined1 auStack_168 [8];
  vector<int,_std::allocator<int>_> tmp;
  long *local_120;
  _InputArray local_100;
  _InputArray local_e8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  Mat *local_b8;
  long local_b0;
  undefined1 auStack_a8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  min_ssd;
  
  pcVar11 = (char *)CONCAT71(in_register_00000009,add_constant);
  uVar1 = **(uint **)(in2 + 0x40);
  uVar21 = (ulong)uVar1;
  uVar2 = (*(uint **)(in2 + 0x40))[1];
  uVar13 = (ulong)uVar2;
  cv::Mat::Mat(local_2a0,uVar1,uVar2,0);
  auStack_a8 = (undefined1  [8])0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bgr_to_grey(local_240);
  bgr_to_grey(local_1e0);
  if (in_R8B != '\0') {
    local_e8.obj = auStack_168;
    auStack_168 = (undefined1  [8])0x4024000000000000;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_100.sz.width = 0;
    local_100.sz.height = 0;
    local_100.flags = 0x1010000;
    local_e8.flags = -0x3efdfffa;
    local_e8.sz.width = 1;
    local_e8.sz.height = 4;
    local_180.super__InputArray.sz.width = 0;
    local_180.super__InputArray.sz.height = 0;
    local_180.super__InputArray.flags = -0x3dff0000;
    local_180.super__InputArray.obj = local_1e0;
    local_100.obj = local_1e0;
    p_Var9 = (_InputArray *)cv::noArray();
    cv::add(&local_100,&local_e8,&local_180,p_Var9,-1);
  }
  __n = (size_type)(int)uVar2;
  if (0 < (int)uVar1) {
    uVar18 = uVar21;
    do {
      local_100.flags = 0x7fffffff;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)auStack_168,__n,&local_100.flags,
                 (allocator_type *)&local_e8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)auStack_a8,(vector<int,_std::allocator<int>_> *)auStack_168);
      if (auStack_168 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_168);
      }
      uVar20 = (int)uVar18 - 1;
      uVar18 = (ulong)uVar20;
    } while (uVar20 != 0);
  }
  local_b0 = -uVar13;
  lVar19 = 0;
  uVar18 = uVar13;
  local_b8 = in1;
  do {
    this = local_b8;
    cv::Mat::Mat((Mat *)auStack_168,uVar1,uVar2,0);
    iVar6 = std::__cxx11::string::compare(pcVar11);
    if (iVar6 == 0) {
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          if (lVar19 != 0) {
            lVar15 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar15 + *local_120 * uVar12) =
                   *(undefined1 *)(lVar15 + *local_198 * uVar12 + local_1d0);
              lVar15 = lVar15 + 1;
            } while (lVar19 != lVar15);
          }
          if (lVar19 < (long)__n) {
            lVar15 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar15 + lVar19 + *local_120 * uVar12) =
                   *(undefined1 *)(lVar15 + *local_198 * uVar12 + local_1d0);
              lVar15 = lVar15 + 1;
            } while (local_b0 + lVar19 + lVar15 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar21);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare(pcVar11);
      if (iVar6 != 0) {
        cv::Mat::Mat(this,0,0,0);
        cv::Mat::~Mat((Mat *)auStack_168);
        goto LAB_00103eb3;
      }
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          if (lVar19 < (long)__n) {
            uVar14 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + uVar14 + *local_120 * uVar12) =
                   *(undefined1 *)(uVar14 + *local_1f8 * uVar12 + local_230 + lVar19);
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
          lVar15 = (long)(int)uVar18;
          if (lVar19 != 0) {
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar15 + *local_120 * uVar12) =
                   *(undefined1 *)(lVar15 + *local_1f8 * uVar12 + local_230);
              lVar15 = lVar15 + 1;
            } while (lVar15 < (long)__n);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar21);
      }
    }
    if (0 < (int)uVar1) {
      cVar5 = (char)lVar19;
      uVar12 = 0;
      local_c0 = lVar19;
      do {
        iVar6 = (int)uVar12;
        uVar14 = 3;
        if (3 < iVar6) {
          uVar14 = uVar12 & 0xffffffff;
        }
        if (0 < (int)uVar2) {
          iVar7 = 3;
          if (3 < iVar6) {
            iVar7 = iVar6;
          }
          iVar10 = iVar6 + 3;
          if ((int)(uVar1 - 1) <= iVar6 + 3) {
            iVar10 = uVar1 - 1;
          }
          uVar16 = 0;
          local_c8 = uVar12;
          do {
            uVar12 = 3;
            if (3 < (int)uVar16) {
              uVar12 = uVar16 & 0xffffffff;
            }
            iVar22 = (int)uVar12 + -3;
            iVar6 = (int)uVar16 + 3;
            if ((int)(uVar2 - 1) <= iVar6) {
              iVar6 = uVar2 - 1;
            }
            local_d0 = uVar16;
            iVar8 = std::__cxx11::string::compare(pcVar11);
            if (iVar8 == 0) {
              if (iVar10 < iVar7 + -3) goto LAB_00103d7d;
              iVar8 = 0;
              lVar19 = uVar14 - 3;
              do {
                if (iVar22 <= iVar6) {
                  lVar15 = uVar12 - 4;
                  do {
                    iVar17 = (uint)*(byte *)(*local_1f8 * lVar19 + local_230 + 1 + lVar15) -
                             (uint)*(byte *)((long)tmp.super__Vector_base<int,_std::allocator<int>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish +
                                            lVar15 + *local_120 * lVar19 + 1);
                    iVar8 = iVar8 + iVar17 * iVar17;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < iVar6);
                }
                bVar4 = lVar19 < iVar10;
                lVar19 = lVar19 + 1;
              } while (bVar4);
            }
            else if (iVar10 < iVar7 + -3) {
LAB_00103d7d:
              iVar8 = 0;
            }
            else {
              iVar8 = 0;
              lVar19 = uVar14 - 3;
              do {
                if (iVar22 <= iVar6) {
                  lVar15 = uVar12 - 4;
                  do {
                    iVar17 = (uint)*(byte *)(*local_198 * lVar19 + local_1d0 + 1 + lVar15) -
                             (uint)*(byte *)((long)tmp.super__Vector_base<int,_std::allocator<int>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish +
                                            lVar15 + *local_120 * lVar19 + 1);
                    iVar8 = iVar8 + iVar17 * iVar17;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < iVar6);
                }
                bVar4 = lVar19 < iVar10;
                lVar19 = lVar19 + 1;
              } while (bVar4);
            }
            piVar3 = (((pointer)((long)auStack_a8 + local_c8 * 0x18))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            if (iVar8 < piVar3[local_d0]) {
              piVar3[local_d0] = iVar8;
              *(char *)(local_d0 + *local_258 * local_c8 + local_290) = cVar5 * '\x03';
            }
            uVar16 = local_d0 + 1;
            uVar12 = local_c8;
            lVar19 = local_c0;
          } while (uVar16 != uVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar21);
    }
    cv::Mat::~Mat((Mat *)auStack_168);
    this = local_b8;
    lVar19 = lVar19 + 1;
    uVar18 = (ulong)((int)uVar18 - 1);
  } while (lVar19 != 0x50);
  cv::Mat::Mat(local_b8,local_2a0);
LAB_00103eb3:
  cv::Mat::~Mat(local_1e0);
  cv::Mat::~Mat(local_240);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)auStack_a8);
  cv::Mat::~Mat(local_2a0);
  return this;
}

Assistant:

Mat
ssd(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat depth(height, width, 0);
    vector< vector<int> > min_ssd; // store min SSD values

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    for (int i = 0; i < height; ++i)
    {
        vector<int> tmp(width, numeric_limits<int>::max());
        min_ssd.push_back(tmp);
    }

    for (int offset = 0; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's SSD value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                int sum_sd = 0;

                if (type == "left")
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(left.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }
                else
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(right.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }

                // smaller SSD value found
                if (sum_sd < min_ssd[y][x])
                {
                    min_ssd[y][x] = sum_sd;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}